

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O0

void __thiscall
QtMWidgets::TableViewCellLayout::setTextGeometry
          (TableViewCellLayout *this,QRect *r,int imageOffset,int accessoryWidth)

{
  TextLabel *pTVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int local_8c;
  int local_7c;
  int local_5c;
  int local_44;
  int h;
  int detailedTextHeight;
  int textHeight;
  int width;
  int accessoryWidth_local;
  int imageOffset_local;
  QRect *r_local;
  TableViewCellLayout *this_local;
  
  iVar2 = QRect::width(r);
  if (accessoryWidth < 1) {
    local_44 = 0;
  }
  else {
    local_44 = (**(code **)(*(long *)this + 0x60))();
  }
  local_44 = ((iVar2 - imageOffset) - accessoryWidth) - local_44;
  iVar2 = (**(code **)(*(long *)this->textLabel + 0x80))(this->textLabel,local_44);
  iVar3 = (**(code **)(*(long *)this->detailedTextLabel + 0x80))(this->detailedTextLabel,local_44);
  if ((iVar3 == 0) && (iVar2 != 0)) {
    pTVar1 = this->textLabel;
    iVar3 = QRect::x(r);
    iVar4 = QRect::y(r);
    iVar5 = QRect::height(r);
    if (iVar2 < iVar5) {
      iVar5 = QRect::height(r);
      local_5c = (iVar5 - iVar2) / 2;
    }
    else {
      local_5c = 0;
    }
    QWidget::setGeometry((QWidget *)pTVar1,iVar3 + imageOffset,iVar4 + local_5c,local_44,iVar2);
    pTVar1 = this->detailedTextLabel;
    iVar2 = QRect::x(r);
    iVar3 = QRect::y(r);
    QWidget::setGeometry((QWidget *)pTVar1,iVar2,iVar3,0,0);
  }
  else if ((iVar2 == 0) && (iVar3 != 0)) {
    pTVar1 = this->detailedTextLabel;
    iVar2 = QRect::x(r);
    iVar4 = QRect::y(r);
    iVar5 = QRect::height(r);
    if (iVar3 < iVar5) {
      iVar5 = QRect::height(r);
      local_7c = (iVar5 - iVar3) / 2;
    }
    else {
      local_7c = 0;
    }
    QWidget::setGeometry((QWidget *)pTVar1,iVar2 + imageOffset,iVar4 + local_7c,local_44,iVar3);
    pTVar1 = this->textLabel;
    iVar2 = QRect::x(r);
    iVar3 = QRect::y(r);
    QWidget::setGeometry((QWidget *)pTVar1,iVar2,iVar3,0,0);
  }
  else if ((iVar2 != 0) && (iVar3 != 0)) {
    iVar4 = QRect::height(r);
    if (iVar2 + iVar3 < iVar4) {
      iVar4 = QRect::height(r);
      local_8c = ((iVar4 - iVar2) - iVar3) / 2;
    }
    else {
      local_8c = 0;
    }
    pTVar1 = this->textLabel;
    iVar4 = QRect::x(r);
    iVar5 = QRect::y(r);
    QWidget::setGeometry((QWidget *)pTVar1,iVar4 + imageOffset,iVar5 + local_8c,local_44,iVar2);
    pTVar1 = this->detailedTextLabel;
    iVar4 = QRect::x(r);
    iVar5 = QRect::y(r);
    QWidget::setGeometry
              ((QWidget *)pTVar1,iVar4 + imageOffset,iVar5 + local_8c + iVar2,local_44,iVar3);
  }
  return;
}

Assistant:

void
TableViewCellLayout::setTextGeometry( const QRect & r, int imageOffset,
	int accessoryWidth )
{
	const int width = r.width() - imageOffset - accessoryWidth -
		( accessoryWidth > 0 ? spacing() : 0 );
	const int textHeight = textLabel->heightForWidth( width );
	const int detailedTextHeight = detailedTextLabel->heightForWidth( width );

	if( detailedTextHeight == 0 && textHeight != 0 )
	{
		textLabel->setGeometry( r.x() + imageOffset, r.y() +
				( r.height() > textHeight ? ( r.height() - textHeight ) / 2 : 0 ),
			width, textHeight );
		detailedTextLabel->setGeometry( r.x(), r.y(), 0, 0 );
	}
	else if( textHeight == 0 && detailedTextHeight != 0 )
	{
		detailedTextLabel->setGeometry( r.x() + imageOffset, r.y() +
				( r.height() > detailedTextHeight ?
					( r.height() - detailedTextHeight ) / 2 : 0 ),
			width, detailedTextHeight );
		textLabel->setGeometry( r.x(), r.y(), 0, 0 );
	}
	else if( textHeight != 0 && detailedTextHeight != 0 )
	{
		const int h = ( r.height() > textHeight + detailedTextHeight ?
			( r.height() - textHeight - detailedTextHeight ) / 2 : 0 );
		textLabel->setGeometry( r.x() + imageOffset, r.y() + h,
			width, textHeight );
		detailedTextLabel->setGeometry( r.x() + imageOffset, r.y() + h +
			textHeight, width, detailedTextHeight );
	}
}